

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_file.c
# Opt level: O2

p2sc_keyfile_t * p2sc_open_keyfile(char *file)

{
  int iVar1;
  p2sc_keyfile_t *ppVar2;
  char *pcVar3;
  GKeyFile *pGVar4;
  char *fmt;
  GError *err;
  
  err = (GError *)0x0;
  ppVar2 = (p2sc_keyfile_t *)g_malloc(0x10);
  pcVar3 = (char *)g_strdup(file);
  ppVar2->name = pcVar3;
  pGVar4 = (GKeyFile *)g_key_file_new();
  ppVar2->key = pGVar4;
  iVar1 = g_key_file_load_from_file(pGVar4,pcVar3,0,&err);
  if ((iVar1 != 0) && (err == (GError *)0x0)) {
    return ppVar2;
  }
  if ((err == (GError *)0x0) || (err->message == (gchar *)0x0)) {
    fmt = "%s: key file load failed - unknown reason";
    iVar1 = 0x29;
  }
  else {
    fmt = "%s: %s";
    iVar1 = 0x26;
  }
  _p2sc_msg("p2sc_open_keyfile",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
            ,iVar1,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",4000,fmt,pcVar3);
  exit(1);
}

Assistant:

p2sc_keyfile_t *p2sc_open_keyfile(const char *file) {
    GError *err = NULL;
    p2sc_keyfile_t *k = (p2sc_keyfile_t *) g_malloc(sizeof *k);

    k->name = g_strdup(file);
    k->key = g_key_file_new();
    if (!g_key_file_load_from_file(k->key, k->name, (GKeyFileFlags) 0, &err) || err) {
        if (err && err->message) {
            P2SC_Msg(LVL_FATAL, "%s: %s", k->name, err->message);
            g_error_free(err);
        } else
            P2SC_Msg(LVL_FATAL, "%s: key file load failed - unknown reason", k->name);
        /* not reached */
        p2sc_free_keyfile(k);
        k = NULL;
    }
    return k;
}